

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O1

int obudec_read_obu_header_and_size
              (AvxInputContext *input_ctx,size_t buffer_capacity,int is_annexb,uint8_t *buffer,
              size_t *bytes_read,size_t *payload_length,ObuHeader *obu_header,_Bool buffered)

{
  bool bVar1;
  _Bool _Var2;
  aom_codec_err_t aVar3;
  size_t buffer_length;
  size_t sVar4;
  int iVar5;
  byte *buf;
  undefined1 auVar6 [16];
  uint64_t obu_size;
  size_t leb128_length_payload;
  uint64_t u64_payload_length;
  size_t local_60;
  size_t *local_58;
  undefined8 local_50;
  size_t local_48;
  size_t local_40;
  size_t *local_38;
  
  auVar6._0_4_ = -(uint)(buffer == (uint8_t *)0x0);
  auVar6._4_4_ = -(uint)(bytes_read == (size_t *)0x0);
  auVar6._8_4_ = -(uint)(payload_length == (size_t *)0x0);
  auVar6._12_4_ = -(uint)(obu_header == (ObuHeader *)0x0);
  iVar5 = movmskps((int)buffer,auVar6);
  if (iVar5 != 0 || buffer_capacity < 0x12) {
    return -1;
  }
  local_60 = 0;
  local_48 = 0;
  local_50 = 0;
  if (is_annexb == 0) {
LAB_00129fd8:
    buffer_length = 0;
    bVar1 = false;
    local_58 = payload_length;
    local_38 = bytes_read;
    if (((obu_header != (ObuHeader *)0x0) && (buffer != (uint8_t *)0x0)) &&
       (1 < buffer_capacity - local_60)) {
      buf = buffer + local_60;
      buffer_length = buffer_input(input_ctx,1,buf,buffered);
      _Var2 = input_eof(input_ctx);
      bVar1 = true;
      if (!_Var2 || buffer_length != 0) {
        if (buffer_length == 1) {
          if ((*buf & 4) != 0) {
            sVar4 = buffer_input(input_ctx,1,buf + 1,buffered);
            if (sVar4 != 1) {
              obudec_read_obu_header_and_size_cold_4();
              goto LAB_0012a199;
            }
            buffer_length = 2;
          }
          local_40 = 0;
          aVar3 = aom_read_obu_header(buf,buffer_length,&local_40,obu_header,is_annexb);
          bVar1 = buffer_length == local_40 && aVar3 == AOM_CODEC_OK;
          if (buffer_length != local_40 || aVar3 != AOM_CODEC_OK) {
            obudec_read_obu_header_and_size_cold_5();
          }
        }
        else {
          obudec_read_obu_header_and_size_cold_3();
LAB_0012a199:
          bVar1 = false;
        }
      }
    }
    if (!bVar1) {
      return -1;
    }
    if (buffer_length == 0) {
      *local_58 = 0;
    }
    else {
      if (obu_header->has_size_field == 0) {
        sVar4 = local_50 - buffer_length;
        if (local_50 < buffer_length) {
          obudec_read_obu_header_and_size_cold_8();
          return -1;
        }
      }
      else {
        local_40 = 0;
        iVar5 = obudec_read_leb128(input_ctx,buffer + buffer_length + local_60,&local_48,&local_40,
                                   buffered);
        if (iVar5 != 0) {
          obudec_read_obu_header_and_size_cold_6();
          return -1;
        }
        sVar4 = local_40;
        if (local_40 >> 0x20 != 0) {
          obudec_read_obu_header_and_size_cold_7();
          return -1;
        }
      }
      *local_58 = sVar4;
      *local_38 = buffer_length + local_60 + local_48;
    }
LAB_0012a153:
    iVar5 = 0;
  }
  else {
    iVar5 = obudec_read_leb128(input_ctx,buffer,&local_60,&local_50,buffered);
    if (iVar5 == 0) {
      if (local_60 == 0) {
        *payload_length = 0;
        goto LAB_0012a153;
      }
      if (local_50._4_4_ == 0) goto LAB_00129fd8;
      obudec_read_obu_header_and_size_cold_2();
    }
    else {
      obudec_read_obu_header_and_size_cold_1();
    }
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int obudec_read_obu_header_and_size(
    struct AvxInputContext *input_ctx, size_t buffer_capacity, int is_annexb,
    uint8_t *buffer, size_t *bytes_read, size_t *payload_length,
    ObuHeader *obu_header, bool buffered) {
  const size_t kMinimumBufferSize = OBU_MAX_HEADER_SIZE;
  if (!input_ctx || !buffer || !bytes_read || !payload_length || !obu_header ||
      buffer_capacity < kMinimumBufferSize) {
    return -1;
  }

  size_t leb128_length_obu = 0;
  size_t leb128_length_payload = 0;
  uint64_t obu_size = 0;
  if (is_annexb) {
    if (obudec_read_leb128(input_ctx, &buffer[0], &leb128_length_obu, &obu_size,
                           buffered) != 0) {
      fprintf(stderr, "obudec: Failure reading OBU size length.\n");
      return -1;
    } else if (leb128_length_obu == 0) {
      *payload_length = 0;
      return 0;
    }
    if (obu_size > UINT32_MAX) {
      fprintf(stderr, "obudec: OBU payload length too large.\n");
      return -1;
    }
  }

  size_t header_size = 0;
  if (obudec_read_obu_header(input_ctx, buffer_capacity - leb128_length_obu,
                             is_annexb, buffer + leb128_length_obu, obu_header,
                             &header_size, buffered) != 0) {
    return -1;
  } else if (header_size == 0) {
    *payload_length = 0;
    return 0;
  }

  if (!obu_header->has_size_field) {
    assert(is_annexb);
    if (obu_size < header_size) {
      fprintf(stderr, "obudec: OBU size is too small.\n");
      return -1;
    }
    *payload_length = (size_t)obu_size - header_size;
  } else {
    uint64_t u64_payload_length = 0;
    if (obudec_read_leb128(input_ctx, &buffer[leb128_length_obu + header_size],
                           &leb128_length_payload, &u64_payload_length,
                           buffered) != 0) {
      fprintf(stderr, "obudec: Failure reading OBU payload length.\n");
      return -1;
    }
    if (u64_payload_length > UINT32_MAX) {
      fprintf(stderr, "obudec: OBU payload length too large.\n");
      return -1;
    }

    *payload_length = (size_t)u64_payload_length;
  }

  *bytes_read = leb128_length_obu + header_size + leb128_length_payload;
  return 0;
}